

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

vector<duckdb::LogicalType,_true> * duckdb::LogicalType::Integral(void)

{
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_109;
  LogicalType local_108 [4];
  LogicalType local_a8;
  LogicalType local_90;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  LogicalType local_30;
  
  LogicalType(local_108,TINYINT);
  LogicalType(local_108 + 1,SMALLINT);
  LogicalType(local_108 + 2,INTEGER);
  LogicalType(local_108 + 3,BIGINT);
  LogicalType(&local_a8,HUGEINT);
  LogicalType(&local_90,UTINYINT);
  LogicalType(&local_78,USMALLINT);
  LogicalType(&local_60,UINTEGER);
  LogicalType(&local_48,UBIGINT);
  LogicalType(&local_30,UHUGEINT);
  __l._M_len = 10;
  __l._M_array = local_108;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (in_RDI,__l,&local_109);
  lVar1 = 0xd8;
  do {
    ~LogicalType((LogicalType *)(&local_108[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return (vector<duckdb::LogicalType,_true> *)in_RDI;
}

Assistant:

const vector<LogicalType> LogicalType::Integral() {
	vector<LogicalType> types = {LogicalType::TINYINT,   LogicalType::SMALLINT, LogicalType::INTEGER,
	                             LogicalType::BIGINT,    LogicalType::HUGEINT,  LogicalType::UTINYINT,
	                             LogicalType::USMALLINT, LogicalType::UINTEGER, LogicalType::UBIGINT,
	                             LogicalType::UHUGEINT};
	return types;
}